

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O3

Promise<capnp::AnyPointer::Pipeline> __thiscall
capnp::LocalCallContext::onTailCall(LocalCallContext *this)

{
  undefined8 *puVar1;
  long *plVar2;
  WeakFulfiller<capnp::AnyPointer::Pipeline> *params;
  long in_RSI;
  _func_int **local_38;
  
  params = (WeakFulfiller<capnp::AnyPointer::Pipeline> *)operator_new(0x18);
  (params->super_WeakFulfillerBase).inner = (PromiseRejector *)0x0;
  (params->super_PromiseFulfiller<capnp::AnyPointer::Pipeline>).super_PromiseRejector.
  _vptr_PromiseRejector = (_func_int **)&PTR_reject_0037bda0;
  (params->super_WeakFulfillerBase).super_Disposer._vptr_Disposer =
       (_func_int **)&PTR_disposeImpl_0037bdd8;
  kj::_::PromiseDisposer::
  alloc<kj::_::AdapterPromiseNode<capnp::AnyPointer::Pipeline,kj::_::PromiseAndFulfillerAdapter<capnp::AnyPointer::Pipeline>>,kj::_::PromiseDisposer,kj::_::WeakFulfiller<capnp::AnyPointer::Pipeline>&>
            ((PromiseDisposer *)&local_38,params);
  puVar1 = *(undefined8 **)(in_RSI + 0x90);
  plVar2 = *(long **)(in_RSI + 0x98);
  *(WeakFulfillerBase **)(in_RSI + 0x90) = &params->super_WeakFulfillerBase;
  *(WeakFulfiller<capnp::AnyPointer::Pipeline> **)(in_RSI + 0x98) = params;
  if (plVar2 != (long *)0x0) {
    (**(code **)*puVar1)(puVar1,(long)plVar2 + *(long *)(*plVar2 + -0x10));
  }
  (this->super_CallContextHook)._vptr_CallContextHook = local_38;
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<AnyPointer::Pipeline> onTailCall() override {
    auto paf = kj::newPromiseAndFulfiller<AnyPointer::Pipeline>();
    tailCallPipelineFulfiller = kj::mv(paf.fulfiller);
    return kj::mv(paf.promise);
  }